

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O1

ktx_error_code_e
compressedTexImage1DCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  GLenum GVar1;
  ktx_error_code_e kVar2;
  
  kVar2 = KTX_INVALID_OPERATION;
  if (faceLodSize >> 0x20 == 0) {
    if (gl.glCompressedTexImage1D == (PFNGLCOMPRESSEDTEXIMAGE1DPROC)0x0) {
      __assert_fail("gl.glCompressedTexImage1D != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                    ,0x1ec,
                    "ktx_error_code_e compressedTexImage1DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
    (*gl.glCompressedTexImage1D)
              (face + *userdata,miplevel,*(GLenum *)((long)userdata + 8),width,0,
               (GLsizei)faceLodSize,pixels);
    GVar1 = (*gl.glGetError)();
    *(GLenum *)((long)userdata + 0x10) = GVar1;
    kVar2 = (uint)(GVar1 != 0) * 9;
  }
  return kVar2;
}

Assistant:

KTX_error_code
compressedTexImage1DCallback(int miplevel, int face,
                             int width, int height,
                             int depth,
                             ktx_uint64_t faceLodSize,
                             void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(depth);
    UNUSED(height);

    if (faceLodSize > UINT32_MAX)
        return KTX_INVALID_OPERATION; // Too big for OpenGL {,ES}.

    assert(gl.glCompressedTexImage1D != NULL);
    gl.glCompressedTexImage1D(cbData->glTarget + face, miplevel,
                             cbData->glInternalformat, width, 0,
                             (ktx_uint32_t)faceLodSize, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}